

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O1

void skip_utf8_bom_should_skip_bom(void)

{
  parse_buffer *ppVar1;
  long in_FS_OFFSET;
  parse_buffer buffer;
  uchar string [6];
  parse_buffer local_58;
  uchar local_18 [8];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.content = local_18;
  builtin_memcpy(local_18,"\xfeff{}",6);
  local_58.offset = 0;
  local_58.depth = 0;
  local_58.length = 6;
  local_58.hooks.allocate = global_hooks.allocate;
  local_58.hooks.deallocate = global_hooks.deallocate;
  local_58.hooks.reallocate = global_hooks.reallocate;
  ppVar1 = skip_utf8_bom(&local_58);
  if (ppVar1 != &local_58) {
    UnityFail(" Expected TRUE Was FALSE",0x1ce);
  }
  UnityAssertEqualNumber(3,local_58.offset & 0xffffffff,(char *)0x0,0x1cf,UNITY_DISPLAY_STYLE_UINT);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void skip_utf8_bom_should_skip_bom(void)
{
    const unsigned char string[] = "\xEF\xBB\xBF{}";
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.content = string;
    buffer.length = sizeof(string);
    buffer.hooks = global_hooks;

    TEST_ASSERT_TRUE(skip_utf8_bom(&buffer) == &buffer);
    TEST_ASSERT_EQUAL_UINT(3U, (unsigned int)buffer.offset);
}